

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int luaopen_string(lua_State *L)

{
  GCtab *key;
  TValue *pTVar1;
  GCtab *in_RDI;
  uint8_t *unaff_retaddr;
  global_State *g;
  GCtab *mt;
  undefined8 in_stack_ffffffffffffff80;
  lua_State *in_stack_ffffffffffffff88;
  lua_State *in_stack_ffffffffffffff98;
  lua_CFunction *in_stack_fffffffffffffff8;
  
  lj_lib_register((lua_State *)mt,(char *)g,unaff_retaddr,in_stack_fffffffffffffff8);
  key = lj_tab_new(in_stack_ffffffffffffff88,(uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                   (uint32_t)in_stack_ffffffffffffff80);
  *(int *)((ulong)(in_RDI->array).ptr32 + 0x200) = (int)key;
  pTVar1 = lj_tab_setstr(in_stack_ffffffffffffff98,in_RDI,(GCstr *)key);
  (pTVar1->field_2).field_0 =
       *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
        (*(long *)&in_RDI->asize + -8);
  (pTVar1->field_2).it = 0xfffffff4;
  key->nomm = 0xfe;
  return 1;
}

Assistant:

LUALIB_API int luaopen_string(lua_State *L)
{
  GCtab *mt;
  global_State *g;
  LJ_LIB_REG(L, LUA_STRLIBNAME, string);
  mt = lj_tab_new(L, 0, 1);
  /* NOBARRIER: basemt is a GC root. */
  g = G(L);
  setgcref(basemt_it(g, LJ_TSTR), obj2gco(mt));
  settabV(L, lj_tab_setstr(L, mt, mmname_str(g, MM_index)), tabV(L->top-1));
  mt->nomm = (uint8_t)(~(1u<<MM_index));
  return 1;
}